

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

void __thiscall MD5::encodeFile(MD5 *this,char *filename,qpdf_offset_t up_to_offset)

{
  int iVar1;
  element_type *peVar2;
  allocator<char> local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  ulong local_450;
  size_t up_to_size;
  size_t to_try;
  size_t so_far;
  size_t len;
  FILE *file;
  char buffer [1024];
  long local_20;
  qpdf_offset_t up_to_offset_local;
  char *filename_local;
  MD5 *this_local;
  
  local_20 = up_to_offset;
  up_to_offset_local = (qpdf_offset_t)filename;
  filename_local = (char *)this;
  len = (size_t)QUtil::safe_fopen(filename,"rb");
  to_try = 0;
  up_to_size = 0x400;
  local_450 = 0;
  if (-1 < local_20) {
    local_450 = QIntC::to_size<long_long>(&local_20);
  }
  do {
    if ((-1 < local_20) && (local_450 < to_try + up_to_size)) {
      up_to_size = local_450 - to_try;
    }
    so_far = fread(&file,1,up_to_size,(FILE *)len);
    if (so_far != 0) {
      encodeDataIncrementally(this,(char *)&file,so_far);
      to_try = so_far + to_try;
      if ((-1 < local_20) && (local_450 <= to_try)) break;
    }
  } while (so_far != 0);
  iVar1 = ferror((FILE *)len);
  if (iVar1 != 0) {
    fclose((FILE *)len);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"MD5: read error on ",&local_491);
    std::operator+(&local_470,&local_490,(char *)up_to_offset_local);
    QUtil::throw_system_error(&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
  }
  fclose((FILE *)len);
  peVar2 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar2->_vptr_QPDFCryptoImpl[5])();
  return;
}

Assistant:

void
MD5::encodeFile(char const* filename, qpdf_offset_t up_to_offset)
{
    char buffer[1024];

    FILE* file = QUtil::safe_fopen(filename, "rb");
    size_t len;
    size_t so_far = 0;
    size_t to_try = 1024;
    size_t up_to_size = 0;
    if (up_to_offset >= 0) {
        up_to_size = QIntC::to_size(up_to_offset);
    }
    do {
        if ((up_to_offset >= 0) && ((so_far + to_try) > up_to_size)) {
            to_try = up_to_size - so_far;
        }
        len = fread(buffer, 1, to_try, file);
        if (len > 0) {
            encodeDataIncrementally(buffer, len);
            so_far += len;
            if ((up_to_offset >= 0) && (so_far >= up_to_size)) {
                break;
            }
        }
    } while (len > 0);
    if (ferror(file)) {
        // Assume, perhaps incorrectly, that errno was set by the underlying call to read....
        (void)fclose(file);
        QUtil::throw_system_error(std::string("MD5: read error on ") + filename);
    }
    (void)fclose(file);

    this->crypto->MD5_finalize();
}